

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bignum_core.c
# Opt level: O0

int mbedtls_mpi_core_get_mont_r2_unsafe(mbedtls_mpi *X,mbedtls_mpi *N)

{
  int local_1c;
  int ret;
  mbedtls_mpi *N_local;
  mbedtls_mpi *X_local;
  
  local_1c = mbedtls_mpi_lset(X,1);
  if (((local_1c == 0) &&
      (local_1c = mbedtls_mpi_shift_l(X,(long)(int)((uint)N->n << 1) << 6), local_1c == 0)) &&
     (local_1c = mbedtls_mpi_mod_mpi(X,X,N), local_1c == 0)) {
    local_1c = mbedtls_mpi_shrink(X,(ulong)N->n);
  }
  return local_1c;
}

Assistant:

int mbedtls_mpi_core_get_mont_r2_unsafe(mbedtls_mpi *X,
                                        const mbedtls_mpi *N)
{
    int ret = MBEDTLS_ERR_ERROR_CORRUPTION_DETECTED;

    MBEDTLS_MPI_CHK(mbedtls_mpi_lset(X, 1));
    MBEDTLS_MPI_CHK(mbedtls_mpi_shift_l(X, N->n * 2 * biL));
    MBEDTLS_MPI_CHK(mbedtls_mpi_mod_mpi(X, X, N));
    MBEDTLS_MPI_CHK(mbedtls_mpi_shrink(X, N->n));

cleanup:
    return ret;
}